

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::LoadTranslations(FSingleLumpFont *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  PalEntry *local_d88;
  PalEntry *local_d68;
  PalEntry *local_d38;
  uint local_d30;
  uint i;
  uint count;
  void *ranges;
  PalEntry local_d18;
  bool usepalette;
  bool useidentity;
  PalEntry local_palette [256];
  BYTE identity [256];
  double luminosity [256];
  FSingleLumpFont *this_local;
  
  local_d38 = &local_d18;
  do {
    PalEntry::PalEntry(local_d38);
    local_d38 = local_d38 + 1;
  } while (local_d38 != local_palette + 0xfe);
  bVar3 = true;
  bVar4 = false;
  iVar1 = (this->super_FFont).FirstChar;
  iVar2 = (this->super_FFont).LastChar;
  if (this->FontType == FONT1) {
    bVar3 = false;
    _i = TArray<TranslationParm,_TranslationParm>::operator[](TranslationParms + 1,0);
    CheckFON1Chars(this,(double *)(identity + 0xf8));
  }
  else {
    if (1 < this->FontType - FONT2) {
      I_Error("Unknown font type in FSingleLumpFont::LoadTranslation.");
      return;
    }
    bVar4 = true;
    FixupPalette(this,(BYTE *)(local_palette + 0xfe),(double *)(identity + 0xf8),this->PaletteData,
                 (bool)(this->RescalePalette & 1),&local_d18);
    _i = TArray<TranslationParm,_TranslationParm>::operator[](TranslationParms,0);
  }
  for (local_d30 = 0; local_d30 < (iVar2 - iVar1) + 1U; local_d30 = local_d30 + 1) {
    if ((this->super_FFont).Chars[local_d30].Pic != (FTexture *)0x0) {
      FFontChar2::SetSourceRemap
                ((FFontChar2 *)(this->super_FFont).Chars[local_d30].Pic,
                 (this->super_FFont).PatchRemap);
    }
  }
  if (bVar3) {
    local_d68 = local_palette + 0xfe;
  }
  else {
    local_d68 = (PalEntry *)0x0;
  }
  if (bVar4) {
    local_d88 = &local_d18;
  }
  else {
    local_d88 = (PalEntry *)0x0;
  }
  FFont::BuildTranslations
            (&this->super_FFont,(double *)(identity + 0xf8),(BYTE *)local_d68,_i,
             (this->super_FFont).ActiveColors,local_d88);
  return;
}

Assistant:

void FSingleLumpFont::LoadTranslations()
{
	double luminosity[256];
	BYTE identity[256];
	PalEntry local_palette[256];
	bool useidentity = true;
	bool usepalette = false;
	const void* ranges;
	unsigned int count = LastChar - FirstChar + 1;

	switch(FontType)
	{
		case FONT1:
			useidentity = false;
			ranges = &TranslationParms[1][0];
			CheckFON1Chars (luminosity);
			break;

		case BMFFONT:
		case FONT2:
			usepalette = true;
			FixupPalette (identity, luminosity, PaletteData, RescalePalette, local_palette);

			ranges = &TranslationParms[0][0];
			break;

		default:
			// Should be unreachable.
			I_Error("Unknown font type in FSingleLumpFont::LoadTranslation.");
			return;
	}

	for(unsigned int i = 0;i < count;++i)
	{
		if(Chars[i].Pic)
			static_cast<FFontChar2*>(Chars[i].Pic)->SetSourceRemap(PatchRemap);
	}

	BuildTranslations (luminosity, useidentity ? identity : NULL, ranges, ActiveColors, usepalette ? local_palette : NULL);
}